

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_shared.cpp
# Opt level: O2

void KokkosTools::KernelTimer::increment_counter_region(char *name,KernelExecutionType kType)

{
  iterator iVar1;
  mapped_type *ppKVar2;
  mapped_type this;
  double dVar3;
  allocator<char> local_81;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>
  local_80;
  string nameStr;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nameStr,name,(allocator<char> *)&local_80);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,name,&local_81);
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>_>
                  *)count_map_abi_cxx11_,&local_80.first);
  std::__cxx11::string::~string((string *)&local_80);
  if (iVar1._M_node == (_Base_ptr)(count_map_abi_cxx11_ + 8)) {
    this = (mapped_type)operator_new(0x48);
    std::__cxx11::string::string((string *)&local_38,(string *)&nameStr);
    KernelPerformanceInfo::KernelPerformanceInfo(this,&local_38,kType);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::string((string *)&local_80,(string *)&nameStr);
    local_80.second = this;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,KokkosTools::KernelTimer::KernelPerformanceInfo*>,std::_Select1st<std::pair<std::__cxx11::string_const,KokkosTools::KernelTimer::KernelPerformanceInfo*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,KokkosTools::KernelTimer::KernelPerformanceInfo*>>>
    ::
    _M_emplace_unique<std::pair<std::__cxx11::string,KokkosTools::KernelTimer::KernelPerformanceInfo*>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,KokkosTools::KernelTimer::KernelPerformanceInfo*>,std::_Select1st<std::pair<std::__cxx11::string_const,KokkosTools::KernelTimer::KernelPerformanceInfo*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,KokkosTools::KernelTimer::KernelPerformanceInfo*>>>
                *)count_map_abi_cxx11_,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  else {
    ppKVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_KokkosTools::KernelTimer::KernelPerformanceInfo_*>_>_>
                            *)count_map_abi_cxx11_,&nameStr);
    this = *ppKVar2;
  }
  (&regions)[current_region_level] = this;
  dVar3 = seconds();
  this->startTime = dVar3;
  current_region_level = current_region_level + 1;
  std::__cxx11::string::~string((string *)&nameStr);
  return;
}

Assistant:

void increment_counter_region(const char* name, KernelExecutionType kType) {
  std::string nameStr(name);

  if (count_map.find(name) == count_map.end()) {
    KernelPerformanceInfo* info = new KernelPerformanceInfo(nameStr, kType);
    count_map.insert(
        std::pair<std::string, KernelPerformanceInfo*>(nameStr, info));

    regions[current_region_level] = info;
  } else {
    regions[current_region_level] = count_map[nameStr];
  }

  regions[current_region_level]->startTimer();
  current_region_level++;
}